

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data;
  conncache *h;
  long lVar1;
  connectbundle *pcVar2;
  connectbundle *p;
  size_t key_len;
  size_t extraout_RDX;
  size_t len;
  CURLcode CVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  char key [128];
  char local_b8 [136];
  
  data = conn->data;
  pcVar2 = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if (pcVar2 == (connectbundle *)0x0) {
    auVar5 = (undefined1  [16])(*Curl_cmalloc)(0x30);
    len = auVar5._8_8_;
    p = auVar5._0_8_;
    if (p == (connectbundle *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      p->num_connections = 0;
      p->multiuse = 0;
      Curl_llist_init(&p->conn_list,conn_llist_dtor);
      CVar3 = CURLE_OK;
      len = extraout_RDX;
    }
    if (p == (connectbundle *)0x0) {
LAB_004fa5fb:
      pcVar2 = (connectbundle *)0x0;
      bVar4 = false;
    }
    else {
      hashkey(conn,local_b8,len);
      h = (data->state).conn_cache;
      key_len = strlen(local_b8);
      pcVar2 = (connectbundle *)Curl_hash_add(&h->hash,local_b8,key_len,p);
      bVar4 = pcVar2 != (connectbundle *)0x0;
      if (bVar4) {
        pcVar2 = p;
      }
      CVar3 = CURLE_OK;
      if (!bVar4) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      if (p != (connectbundle *)0x0 && !bVar4) {
        Curl_llist_destroy(&p->conn_list,(void *)0x0);
        (*Curl_cfree)(p);
        CVar3 = CURLE_OUT_OF_MEMORY;
        goto LAB_004fa5fb;
      }
    }
    if (!bVar4) goto LAB_004fa634;
  }
  else {
    CVar3 = CURLE_OK;
  }
  Curl_llist_insert_next(&pcVar2->conn_list,(pcVar2->conn_list).tail,conn,&conn->bundle_node);
  conn->bundle = pcVar2;
  pcVar2->num_connections = pcVar2->num_connections + 1;
  lVar1 = connc->next_connection_id;
  connc->next_connection_id = lVar1 + 1;
  conn->connection_id = lVar1;
  connc->num_conn = connc->num_conn + 1;
LAB_004fa634:
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
    bundle = new_bundle;
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %zu members\n",
               conn->connection_id, connc->num_conn));

  unlock:
  CONN_UNLOCK(data);

  return result;
}